

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_comparison_join.cpp
# Opt level: O1

void duckdb::PhysicalComparisonJoin::ConstructEmptyJoinResult
               (JoinType join_type,bool has_null,DataChunk *input,DataChunk *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  reference pvVar3;
  reference pvVar4;
  long lVar5;
  reference other;
  TemplatedValidityData<unsigned_long> *pTVar6;
  unsigned_long uVar7;
  undefined7 in_register_00000039;
  size_type sVar8;
  idx_t k;
  ulong uVar9;
  ulong uVar10;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  switch((int)CONCAT71(in_register_00000039,join_type)) {
  case 1:
  case 4:
  case 8:
    result->count = input->count;
    if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
    }
    else {
      sVar8 = 0;
      do {
        pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar8);
        pvVar4 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar8);
        Vector::Reference(pvVar3,pvVar4);
        sVar8 = sVar8 + 1;
        uVar9 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      } while (sVar8 < uVar9);
    }
    lVar5 = (long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    for (; uVar9 < (ulong)((lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5); uVar9 = uVar9 + 1) {
      pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar9);
      Vector::SetVectorType(pvVar3,CONSTANT_VECTOR);
      pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar9);
      ConstantVector::SetNull(pvVar3,true);
      lVar5 = (long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    break;
  case 6:
    DataChunk::Reference(result,input);
    return;
  case 7:
    pvVar3 = vector<duckdb::Vector,_true>::back(&result->data);
    result->count = input->count;
    if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar8 = 0;
      do {
        pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar8);
        other = vector<duckdb::Vector,_true>::operator[](&input->data,sVar8);
        Vector::Reference(pvVar4,other);
        sVar8 = sVar8 + 1;
      } while (sVar8 < (ulong)(((long)(input->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(input->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
    }
    if (has_null) {
      FlatVector::VerifyFlatVector(pvVar3);
      uVar9 = result->count;
      if ((pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        local_38 = (pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_48,&local_38);
        p_Var2 = p_Stack_40;
        peVar1 = local_48;
        local_48 = (element_type *)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this = (pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar1;
        (pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var2;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
        }
        pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (&(pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data);
        (pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)
             (pTVar6->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      if (uVar9 != 0) {
        uVar10 = uVar9 + 0x3f >> 6;
        if (uVar10 != 1) {
          switchD_01306cb1::default
                    ((pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,0,
                     uVar10 * 8 - 8);
        }
        uVar7 = -1L << ((byte)uVar9 & 0x3f);
        if ((uVar9 & 0x3f) == 0) {
          uVar7 = 0;
        }
        (pvVar3->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 - 1] =
             uVar7;
      }
    }
    else if (result->count != 0) {
      switchD_01306cb1::default(pvVar3->data,0,result->count);
      return;
    }
  }
  return;
}

Assistant:

void PhysicalComparisonJoin::ConstructEmptyJoinResult(JoinType join_type, bool has_null, DataChunk &input,
                                                      DataChunk &result) {
	// empty hash table, special case
	if (join_type == JoinType::ANTI) {
		// anti join with empty hash table, NOP join
		// return the input
		D_ASSERT(input.ColumnCount() == result.ColumnCount());
		result.Reference(input);
	} else if (join_type == JoinType::MARK) {
		// MARK join with empty hash table
		D_ASSERT(result.ColumnCount() == input.ColumnCount() + 1);
		auto &result_vector = result.data.back();
		D_ASSERT(result_vector.GetType() == LogicalType::BOOLEAN);
		// for every data vector, we just reference the child chunk
		result.SetCardinality(input);
		for (idx_t i = 0; i < input.ColumnCount(); i++) {
			result.data[i].Reference(input.data[i]);
		}
		// for the MARK vector:
		// if the HT has no NULL values (i.e. empty result set), return a vector that has false for every input
		// entry if the HT has NULL values (i.e. result set had values, but all were NULL), return a vector that
		// has NULL for every input entry
		if (!has_null) {
			auto bool_result = FlatVector::GetData<bool>(result_vector);
			for (idx_t i = 0; i < result.size(); i++) {
				bool_result[i] = false;
			}
		} else {
			FlatVector::Validity(result_vector).SetAllInvalid(result.size());
		}
	} else if (join_type == JoinType::LEFT || join_type == JoinType::OUTER || join_type == JoinType::SINGLE) {
		// LEFT/FULL OUTER/SINGLE join and build side is empty
		// for the LHS we reference the data
		result.SetCardinality(input.size());
		for (idx_t i = 0; i < input.ColumnCount(); i++) {
			result.data[i].Reference(input.data[i]);
		}
		// for the RHS
		for (idx_t k = input.ColumnCount(); k < result.ColumnCount(); k++) {
			result.data[k].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result.data[k], true);
		}
	}
}